

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marshalling.cc
# Opt level: O3

bool __thiscall
absl::lts_20240722::flags_internal::ParseFlagImpl<unsigned_int>
          (flags_internal *this,string_view text,uint *dst)

{
  undefined1 uVar1;
  int iVar2;
  undefined8 in_RAX;
  flags_internal *pfVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  flags_internal *this_00;
  string_view sVar8;
  uint32_t val;
  undefined4 local_24;
  
  local_24 = (undefined4)((ulong)in_RAX >> 0x20);
  sVar8 = StripLeadingAsciiWhitespace((lts_20240722 *)this,text);
  pcVar5 = sVar8._M_str;
  pfVar3 = (flags_internal *)sVar8._M_len;
  pcVar4 = pcVar5 + (long)pfVar3;
  pcVar7 = pcVar4;
  if (0 < (long)pfVar3 >> 2) {
    pcVar7 = pcVar5 + ((uint)sVar8._M_len & 3);
    pcVar6 = (char *)(((long)pfVar3 >> 2) + 1);
    do {
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-1]) & 8) == 0)
      goto LAB_00105393;
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-2]) & 8) == 0) {
        pcVar4 = pcVar4 + -1;
        goto LAB_00105393;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-3]) & 8) == 0) {
        pcVar4 = pcVar4 + -2;
        goto LAB_00105393;
      }
      if ((*(byte *)((long)&ascii_internal::kPropertyBits + (ulong)(byte)pcVar4[-4]) & 8) == 0) {
        pcVar4 = pcVar4 + -3;
        goto LAB_00105393;
      }
      pcVar4 = pcVar4 + -4;
      pcVar6 = pcVar6 + -1;
    } while (1 < (long)pcVar6);
  }
  pcVar6 = pcVar7 + -(long)pcVar5;
  if (pcVar6 != (char *)0x1) {
    if (pcVar6 != (char *)0x2) {
      pcVar4 = pcVar5;
      if ((pcVar6 != (char *)0x3) ||
         (pcVar6 = (char *)(ulong)(byte)pcVar7[-1], pcVar4 = pcVar7,
         (*(byte *)((long)&ascii_internal::kPropertyBits + (long)pcVar6) & 8) == 0))
      goto LAB_00105393;
      pcVar7 = pcVar7 + -1;
    }
    pcVar6 = (char *)(ulong)(byte)pcVar7[-1];
    pcVar4 = pcVar7;
    if ((*(byte *)((long)&ascii_internal::kPropertyBits + (long)pcVar6) & 8) == 0)
    goto LAB_00105393;
    pcVar7 = pcVar7 + -1;
  }
  pcVar6 = (char *)(ulong)(byte)pcVar7[-1];
  pcVar4 = pcVar7;
  if ((*(byte *)((long)&ascii_internal::kPropertyBits + (long)pcVar6) & 8) != 0) {
    pcVar4 = pcVar5;
  }
LAB_00105393:
  this_00 = (flags_internal *)(pcVar4 + -(long)pcVar5);
  if (pfVar3 < (flags_internal *)(pcVar4 + -(long)pcVar5)) {
    this_00 = pfVar3;
  }
  sVar8._M_str = pcVar6;
  sVar8._M_len = (size_t)pcVar5;
  iVar2 = NumericBase(this_00,sVar8);
  uVar1 = absl::lts_20240722::numbers_internal::safe_strtou32_base(this_00,pcVar5,&local_24,iVar2);
  *(undefined4 *)text._M_str = local_24;
  return (bool)uVar1;
}

Assistant:

inline bool ParseFlagImpl(absl::string_view text, IntType& dst) {
  text = absl::StripAsciiWhitespace(text);

  return absl::numbers_internal::safe_strtoi_base(text, &dst,
                                                  NumericBase(text));
}